

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O3

void __thiscall
groundupdbext::FileKeyValueStore::FileKeyValueStore(FileKeyValueStore *this,string *fullpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  Impl *this_00;
  pointer *__ptr;
  path local_48;
  
  (this->super_KeyValueStore).super_Store._vptr_Store =
       (_func_int **)&PTR__FileKeyValueStore_0013ac40;
  this_00 = (Impl *)operator_new(0x80,0x40);
  paVar1 = &local_48._M_pathname.field_2;
  pcVar2 = (fullpath->_M_dataplus)._M_p;
  local_48._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + fullpath->_M_string_length);
  Impl::Impl(this_00,&local_48._M_pathname);
  (this->mImpl)._M_t.
  super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
  .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_pathname._M_dataplus._M_p,
                    local_48._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,fullpath,auto_format);
  cVar3 = std::filesystem::status(&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  if ((cVar3 == -1) || (cVar3 == '\0')) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_48,fullpath,auto_format);
    std::filesystem::create_directories(&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
  }
  return;
}

Assistant:

FileKeyValueStore::FileKeyValueStore(std::string fullpath)
  : mImpl(std::make_unique<FileKeyValueStore::Impl>(fullpath))
{
  if (!fs::exists(fullpath)) {
      fs::create_directories(fullpath);
  }
}